

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidget.cpp
# Opt level: O3

void __thiscall QWidgetPrivate::hide_helper(QWidgetPrivate *this)

{
  long *plVar1;
  long *plVar2;
  uint uVar3;
  QWidget *popup;
  long lVar4;
  QWidgetRepaintManager *this_00;
  QWidgetData *pQVar5;
  QWidget *pQVar6;
  long lVar7;
  short sVar8;
  long in_FS_OFFSET;
  undefined1 *local_58;
  undefined1 *puStack_50;
  code *local_48;
  undefined8 local_40;
  QWidget *pQStack_38;
  undefined8 local_30;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  popup = *(QWidget **)&this->field_0x8;
  pQVar5 = popup->data;
  uVar3 = (pQVar5->window_flags).super_QFlagsStorageHelper<Qt::WindowType,_4>.
          super_QFlagsStorage<Qt::WindowType>.i;
  pQVar6 = popup;
  if ((uVar3 & 1) == 0) {
LAB_00308e43:
    if ((uVar3 & 0xff) == 9) {
      QApplicationPrivate::closePopup(*(QApplicationPrivate **)(QCoreApplication::self + 8),popup);
      pQVar5 = popup->data;
    }
  }
  else {
    do {
      if (((pQVar6->data->window_flags).super_QFlagsStorageHelper<Qt::WindowType,_4>.
           super_QFlagsStorage<Qt::WindowType>.i & 0x20000000) != 0) goto LAB_00308e43;
      pQVar6 = *(QWidget **)(*(long *)&pQVar6->field_0x8 + 0x10);
    } while (pQVar6 != (QWidget *)0x0);
    lVar7 = *(long *)&popup->field_0x8;
    do {
      if (*(long *)(lVar7 + 0x10) == 0) goto LAB_00308e43;
      lVar7 = *(long *)(*(long *)(lVar7 + 0x10) + 8);
    } while ((*(long *)(lVar7 + 0x78) == 0) || (*(long *)(*(long *)(lVar7 + 0x78) + 0x10) == 0));
  }
  if ((pQVar5->widget_attributes >> 0xb & 1) != 0) {
    pQVar5->widget_attributes = pQVar5->widget_attributes & 0xfffff7ff;
  }
  hide_sys(this);
  uVar3 = popup->data->widget_attributes;
  sVar8 = (short)uVar3;
  if (sVar8 < 0) {
    popup->data->widget_attributes = uVar3 & 0xffff7fff;
    local_58 = &DAT_aaaaaaaaaaaaaaaa;
    puStack_50 = &DAT_aaaaaaaaaaaaaaaa;
    QHideEvent::QHideEvent((QHideEvent *)&local_58);
    QCoreApplication::sendEvent(&popup->super_QObject,(QEvent *)&local_58);
    hideChildren(this,false);
    QApplicationPrivate::sendSyntheticEnterLeave
              (*(QApplicationPrivate **)(QCoreApplication::self + 8),popup);
    pQVar6 = QApplication::focusWidget();
    while( true ) {
      if ((pQVar6 == (QWidget *)0x0) ||
         (((pQVar6->data->window_flags).super_QFlagsStorageHelper<Qt::WindowType,_4>.
           super_QFlagsStorage<Qt::WindowType>.i & 1) != 0)) goto LAB_00308eba;
      if (pQVar6 == popup) break;
      pQVar6 = *(QWidget **)(*(long *)&pQVar6->field_0x8 + 0x10);
    }
    (**(code **)(*(long *)popup + 0x198))(popup,1);
  }
  else {
    local_58 = &DAT_aaaaaaaaaaaaaaaa;
    puStack_50 = &DAT_aaaaaaaaaaaaaaaa;
    QHideEvent::QHideEvent((QHideEvent *)&local_58);
    QCoreApplication::sendEvent(&popup->super_QObject,(QEvent *)&local_58);
    hideChildren(this,false);
  }
LAB_00308eba:
  lVar7 = *(long *)&this->field_0x8;
  do {
    plVar1 = (long *)(lVar7 + 8);
    lVar4 = *(long *)(*plVar1 + 0x10);
    if (lVar4 == 0) break;
    plVar2 = (long *)(lVar7 + 0x20);
    lVar7 = lVar4;
  } while ((*(uint *)(*plVar2 + 0xc) & 1) == 0);
  lVar7 = *(long *)(*plVar1 + 0x78);
  if (((lVar7 != 0) && (lVar7 = *(long *)(lVar7 + 8), lVar7 != 0)) &&
     (this_00 = *(QWidgetRepaintManager **)(lVar7 + 8), this_00 != (QWidgetRepaintManager *)0x0)) {
    QWidgetRepaintManager::removeDirtyWidget(this_00,popup);
  }
  if (sVar8 < 0) {
    local_48 = QFont::strikeOut;
    local_40 = 0xaaaaaaaa00008003;
    local_30 = 0xaaaaaaaaffffffff;
    pQStack_38 = popup;
    QAccessible::updateAccessibility((QAccessibleEvent *)&local_48);
    QAccessibleEvent::~QAccessibleEvent((QAccessibleEvent *)&local_48);
  }
  QHideEvent::~QHideEvent((QHideEvent *)&local_58);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_28) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QWidgetPrivate::hide_helper()
{
    Q_Q(QWidget);

    bool isEmbedded = false;
#if QT_CONFIG(graphicsview)
    isEmbedded = q->isWindow() && !bypassGraphicsProxyWidget(q) && nearestGraphicsProxyWidget(q->parentWidget()) != nullptr;
#else
    Q_UNUSED(isEmbedded);
#endif

    if (!isEmbedded && (q->windowType() == Qt::Popup))
        qApp->d_func()->closePopup(q);

    q->setAttribute(Qt::WA_Mapped, false);
    hide_sys();

    bool wasVisible = q->testAttribute(Qt::WA_WState_Visible);

    if (wasVisible) {
        q->setAttribute(Qt::WA_WState_Visible, false);

    }

    QHideEvent hideEvent;
    QCoreApplication::sendEvent(q, &hideEvent);
    hideChildren(false);

    // next bit tries to move the focus if the focus widget is now
    // hidden.
    if (wasVisible) {
        qApp->d_func()->sendSyntheticEnterLeave(q);
        QWidget *fw = QApplication::focusWidget();
        while (fw &&  !fw->isWindow()) {
            if (fw == q) {
                q->focusNextPrevChild(true);
                break;
            }
            fw = fw->parentWidget();
        }
    }

    if (QWidgetRepaintManager *repaintManager = maybeRepaintManager())
        repaintManager->removeDirtyWidget(q);

#if QT_CONFIG(accessibility)
    if (wasVisible) {
        QAccessibleEvent event(q, QAccessible::ObjectHide);
        QAccessible::updateAccessibility(&event);
    }
#endif
}